

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  tree234 *t;
  bool bVar8;
  int in [60];
  
  iVar3 = verbose;
  lVar6 = 1;
  while( true ) {
    if (argc <= lVar6) {
      for (lVar6 = 0; lVar6 != 0x3c; lVar6 = lVar6 + 1) {
        in[lVar6] = 0;
      }
      array = (void **)0x0;
      arraysize = 0;
      arraylen = 0;
      tree = newtree234(mycmp);
      cmp = mycmp;
      verify();
      searchtest();
      uVar7 = 0;
      for (uVar5 = 0; uVar5 != 10000; uVar5 = uVar5 + 1) {
        uVar7 = uVar7 * 0x41c64e6d + 0x3039;
        uVar4 = (ushort)((uVar7 >> 0x10 & 0x7fff) % 0x3c);
        if (verbose != 0) {
          printf("trial: %d\n",(ulong)uVar5);
        }
        if (in[uVar4] == 0) {
          if (verbose != 0) {
            printf("adding %s (%d)\n",strings[uVar4]);
          }
          addtest(strings[uVar4]);
          iVar3 = 1;
        }
        else {
          if (verbose != 0) {
            printf("deleting %s (%d)\n",strings[uVar4]);
          }
          deltest(strings[uVar4]);
          iVar3 = 0;
        }
        in[uVar4] = iVar3;
        findtest();
        searchtest();
      }
      while (0 < arraylen) {
        uVar7 = uVar7 * 0x41c64e6d + 0x3039;
        deltest(array[(ulong)(uVar7 >> 0x10 & 0x7fff) % (ulong)(uint)arraylen]);
      }
      freetree234(tree);
      tree = newtree234((cmpfn234)0x0);
      cmp = (cmpfn234)0x0;
      verify();
      for (uVar5 = 0; uVar5 != 1000; uVar5 = uVar5 + 1) {
        if (verbose == 0) {
          bVar8 = true;
        }
        else {
          printf("trial: %d\n",(ulong)uVar5);
          bVar8 = verbose == 0;
        }
        uVar4 = (ushort)((uVar7 * 0x41c64e6d + 0x3039 >> 0x10 & 0x7fff) % 0x3c);
        uVar7 = uVar7 * -0x3d5d6597 + 0xd3dc167e;
        iVar3 = count234(tree);
        uVar2 = (long)(ulong)(uVar7 >> 0x10 & 0x7fff) % (long)(iVar3 + 1);
        if (!bVar8) {
          printf("adding string %s at index %d\n",strings[uVar4],uVar2 & 0xffffffff);
        }
        addpostest(strings[uVar4],(int)uVar2);
      }
      while (t = tree, uVar5 = count234(tree), 0 < (int)uVar5) {
        if (verbose == 0) {
          bVar8 = true;
        }
        else {
          printf("cleanup: tree size %d\n",(ulong)uVar5);
          bVar8 = verbose == 0;
          t = tree;
        }
        uVar7 = uVar7 * 0x41c64e6d + 0x3039;
        iVar3 = count234(t);
        uVar2 = (long)(ulong)(uVar7 >> 0x10 & 0x7fff) % (long)iVar3;
        if (!bVar8) {
          printf("deleting string %s from index %d\n",array[uVar2 & 0xffffffff],uVar2 & 0xffffffff);
        }
        delpostest((int)uVar2);
      }
      printf("%d errors found\n",(ulong)(uint)n_errors);
      return (uint)(n_errors != 0);
    }
    pcVar1 = argv[lVar6];
    if (((*pcVar1 != '-') || (pcVar1[1] != 'v')) || (pcVar1[2] != '\0')) break;
    verbose = iVar3 + (int)lVar6;
    lVar6 = lVar6 + 1;
  }
  fprintf(_stderr,"unrecognised option \'%s\'\n");
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    int in[NSTR];
    int i, j, k;
    unsigned seed = 0;

    for (i = 1; i < argc; i++) {
        char *arg = argv[i];
        if (!strcmp(arg, "-v")) {
            verbose++;
        } else {
            fprintf(stderr, "unrecognised option '%s'\n", arg);
            return 1;
        }
    }

    for (i = 0; i < NSTR; i++)
        in[i] = 0;
    array = NULL;
    arraylen = arraysize = 0;
    tree = newtree234(mycmp);
    cmp = mycmp;

    verify();
    searchtest();
    for (i = 0; i < 10000; i++) {
        j = randomnumber(&seed);
        j %= NSTR;
        if (verbose)
            printf("trial: %d\n", i);
        if (in[j]) {
            if (verbose)
                printf("deleting %s (%d)\n", strings[j], j);
            deltest(strings[j]);
            in[j] = 0;
        } else {
            if (verbose)
                printf("adding %s (%d)\n", strings[j], j);
            addtest(strings[j]);
            in[j] = 1;
        }
        findtest();
        searchtest();
    }

    while (arraylen > 0) {
        j = randomnumber(&seed);
        j %= arraylen;
        deltest(array[j]);
    }

    freetree234(tree);

    /*
     * Now try an unsorted tree. We don't really need to test
     * delpos234 because we know del234 is based on it, so it's
     * already been tested in the above sorted-tree code; but for
     * completeness we'll use it to tear down our unsorted tree
     * once we've built it.
     */
    tree = newtree234(NULL);
    cmp = NULL;
    verify();
    for (i = 0; i < 1000; i++) {
        if (verbose)
            printf("trial: %d\n", i);
        j = randomnumber(&seed);
        j %= NSTR;
        k = randomnumber(&seed);
        k %= count234(tree) + 1;
        if (verbose)
            printf("adding string %s at index %d\n", strings[j], k);
        addpostest(strings[j], k);
    }
    while (count234(tree) > 0) {
        if (verbose)
            printf("cleanup: tree size %d\n", count234(tree));
        j = randomnumber(&seed);
        j %= count234(tree);
        if (verbose)
            printf("deleting string %s from index %d\n",
                   (const char *)array[j], j);
        delpostest(j);
    }

    printf("%d errors found\n", n_errors);
    return (n_errors != 0);
}